

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

ssize_t http_decode_url(char *dest,char *url_data,size_t length)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  byte *pbVar4;
  char *pos;
  byte bVar5;
  
  pbVar3 = (byte *)dest;
  if (0 < (long)length) {
    pbVar4 = (byte *)(url_data + length);
    do {
      bVar1 = *url_data;
      if (bVar1 == 0x25) {
        bVar1 = ((byte *)url_data)[1];
        bVar5 = bVar1 - 0x30;
        if (9 < bVar5) {
          if (0x25 < bVar1 - 0x41) {
            return -1;
          }
          if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
            return -1;
          }
          bVar5 = bVar1 + 0xa9;
        }
        *pbVar3 = bVar5 << 4;
        bVar1 = ((byte *)url_data)[2];
        bVar2 = bVar1 - 0x30;
        if (9 < bVar2) {
          if (0x25 < bVar1 - 0x41) {
            return -1;
          }
          if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
            return -1;
          }
          bVar2 = (bVar1 | 0x20) + 0xa9;
        }
        *pbVar3 = bVar2 | bVar5 << 4;
        url_data = (char *)((byte *)url_data + 3);
      }
      else if (bVar1 == 0x2b) {
        *pbVar3 = 0x20;
        url_data = (char *)((byte *)url_data + 1);
      }
      else {
        url_data = (char *)((byte *)url_data + 1);
        *pbVar3 = bVar1;
      }
      pbVar3 = pbVar3 + 1;
    } while (url_data < pbVar4);
  }
  *pbVar3 = 0;
  return (long)pbVar3 - (long)dest;
}

Assistant:

ssize_t http_decode_url(char *dest, const char *url_data, size_t length) {
  char *pos = dest;
  const char *end = url_data + length;
  while (url_data < end) {
    if (*url_data == '+') {
      // decode space
      *(pos++) = ' ';
      ++url_data;
    } else if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}